

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckBool(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            *this,Context *context,bool param_2)

{
  uint uVar1;
  ValueType *pVVar2;
  Ch *pCVar3;
  
  uVar1 = this->type_;
  if ((uVar1 & 2) == 0) {
    pVVar2 = GetBooleanString();
    DisallowedType(this,context,pVVar2);
    context->invalidCode = kValidateErrorType;
    pVVar2 = GetTypeString();
    pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar2);
    context->invalidKeyword = pCVar3;
  }
  return SUB41((uVar1 & 2) >> 1,0);
}

Assistant:

bool CheckBool(Context& context, bool) const {
        if (!(type_ & (1 << kBooleanSchemaType))) {
            DisallowedType(context, GetBooleanString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }
        return true;
    }